

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferCopyTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::BufferCopyTests::init(BufferCopyTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  Context *pCVar3;
  TestNode *pTVar4;
  char *pcVar5;
  BasicBufferCopyCase *pBVar6;
  long lVar7;
  ulong extraout_RAX;
  SingleBufferCopyCase *this_00;
  ulong uVar8;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string name_1;
  VerifyType verify_2;
  deUint32 hint_2;
  deUint32 dstTarget_2;
  deUint32 srcTarget_2;
  int dstTargetNdx_1;
  int srcTargetNdx_1;
  TestCaseGroup *singleBufGroup;
  VerifyType verify_1;
  deUint32 hint_1;
  deUint32 dstTarget_1;
  deUint32 srcTarget_1;
  int ndx;
  TestCaseGroup *subrangeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string name;
  VerifyType verify;
  deUint32 hint;
  int size;
  deUint32 dstTarget;
  deUint32 srcTarget;
  int dstTargetNdx;
  int srcTargetNdx;
  TestCaseGroup *basicGroup;
  BufferCopyTests *this_local;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic buffer copy cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (srcTarget = 0; (int)srcTarget < 8; srcTarget = srcTarget + 1) {
    for (dstTarget = 0; (int)dstTarget < 8; dstTarget = dstTarget + 1) {
      if (srcTarget != dstTarget) {
        dVar1 = init::bufferTargets[(int)srcTarget];
        dVar2 = init::bufferTargets[(int)dstTarget];
        name.field_2._12_4_ = 0x88e4;
        name.field_2._8_4_ = 0;
        pcVar5 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,pcVar5,(allocator<char> *)((long)&subrangeGroup + 7));
        std::operator+(&local_a0,&local_c0,"_");
        pcVar5 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,&local_a0,pcVar5);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&subrangeGroup + 7));
        pBVar6 = (BasicBufferCopyCase *)operator_new(0xe8);
        pCVar3 = (this->super_TestCaseGroup).m_context;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        BasicBufferCopyCase::BasicBufferCopyCase
                  (pBVar6,pCVar3,pcVar5,"",dVar1,0x3f9,0x88e4,dVar2,0x3f9,0x88e4,0,0,0x3f9,
                   name.field_2._8_4_);
        tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar6);
        std::__cxx11::string::~string((string *)local_80);
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"subrange",
             "Buffer subrange copy tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (dstTarget_1 = 0; (int)dstTarget_1 < 7; dstTarget_1 = dstTarget_1 + 1) {
    pBVar6 = (BasicBufferCopyCase *)operator_new(0xe8);
    lVar7 = (long)(int)dstTarget_1;
    BasicBufferCopyCase::BasicBufferCopyCase
              (pBVar6,(this->super_TestCaseGroup).m_context,init::cases[lVar7].name,"",0x8f36,
               init::cases[lVar7].srcSize,0x88e4,0x8f37,init::cases[lVar7].dstSize,0x88e4,
               init::cases[lVar7].srcOffset,init::cases[lVar7].dstOffset,init::cases[lVar7].copySize
               ,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar6);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_buffer","Copies within single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  srcTarget_2 = 0;
  uVar8 = extraout_RAX;
  while ((int)srcTarget_2 < 8) {
    for (dstTarget_2 = 0; (int)dstTarget_2 < 8; dstTarget_2 = dstTarget_2 + 1) {
      if (srcTarget_2 != dstTarget_2) {
        dVar1 = init::bufferTargets[(int)srcTarget_2];
        dVar2 = init::bufferTargets[(int)dstTarget_2];
        name_1.field_2._12_4_ = 0x88e4;
        name_1.field_2._8_4_ = 0;
        pcVar5 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar5,&local_169);
        std::operator+(&local_148,&local_168,"_");
        pcVar5 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,&local_148,pcVar5);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
        this_00 = (SingleBufferCopyCase *)operator_new(0xd0);
        pCVar3 = (this->super_TestCaseGroup).m_context;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        SingleBufferCopyCase::SingleBufferCopyCase
                  (this_00,pCVar3,pcVar5,"",dVar1,dVar2,0x88e4,name_1.field_2._8_4_);
        tcu::TestNode::addChild(pTVar4,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)local_128);
      }
    }
    srcTarget_2 = srcTarget_2 + 1;
    uVar8 = (ulong)srcTarget_2;
  }
  return (int)uVar8;
}

Assistant:

void BufferCopyTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic buffer copy cases");
		addChild(basicGroup);

		for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); srcTargetNdx++)
		{
			for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); dstTargetNdx++)
			{
				if (srcTargetNdx == dstTargetNdx)
					continue;

				deUint32		srcTarget		= bufferTargets[srcTargetNdx];
				deUint32		dstTarget		= bufferTargets[dstTargetNdx];
				const int		size			= 1017;
				const deUint32	hint			= GL_STATIC_DRAW;
				VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;
				string			name			= string(getBufferTargetName(srcTarget)) + "_" + getBufferTargetName(dstTarget);

				basicGroup->addChild(new BasicBufferCopyCase(m_context, name.c_str(), "", srcTarget, size, hint, dstTarget, size, hint, 0, 0, size, verify));
			}
		}
	}

	// .subrange
	{
		tcu::TestCaseGroup* subrangeGroup = new tcu::TestCaseGroup(m_testCtx, "subrange", "Buffer subrange copy tests");
		addChild(subrangeGroup);

		static const struct
		{
			const char*		name;
			int				srcSize;
			int				dstSize;
			int				srcOffset;
			int				dstOffset;
			int				copySize;
		} cases[] =
		{
			//						srcSize		dstSize		srcOffs		dstOffs		copySize
			{ "middle",				1000,		1000,		250,		250,		500 },
			{ "small_to_large",		100,		1000,		0,			409,		100 },
			{ "large_to_small",		1000,		100,		409,		0,			100 },
			{ "low_to_high_1",		1000,		1000,		0,			500,		500 },
			{ "low_to_high_2",		997,		1027,		0,			701,		111 },
			{ "high_to_low_1",		1000,		1000,		500,		0,			500 },
			{ "high_to_low_2",		1027,		997,		701,		17,			111 }
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		{
			deUint32		srcTarget		= GL_COPY_READ_BUFFER;
			deUint32		dstTarget		= GL_COPY_WRITE_BUFFER;
			deUint32		hint			= GL_STATIC_DRAW;
			VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;

			subrangeGroup->addChild(new BasicBufferCopyCase(m_context, cases[ndx].name, "",
															srcTarget, cases[ndx].srcSize, hint,
															dstTarget, cases[ndx].dstSize, hint,
															cases[ndx].srcOffset, cases[ndx].dstOffset, cases[ndx].copySize,
															verify));
		}
	}

	// .single_buffer
	{
		tcu::TestCaseGroup* singleBufGroup = new tcu::TestCaseGroup(m_testCtx, "single_buffer", "Copies within single buffer");
		addChild(singleBufGroup);

		for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); srcTargetNdx++)
		{
			for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); dstTargetNdx++)
			{
				if (srcTargetNdx == dstTargetNdx)
					continue;

				deUint32		srcTarget		= bufferTargets[srcTargetNdx];
				deUint32		dstTarget		= bufferTargets[dstTargetNdx];
				const deUint32	hint			= GL_STATIC_DRAW;
				VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;
				string			name			= string(getBufferTargetName(srcTarget)) + "_" + getBufferTargetName(dstTarget);

				singleBufGroup->addChild(new SingleBufferCopyCase(m_context, name.c_str(), "", srcTarget, dstTarget, hint, verify));
			}
		}
	}
}